

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool QtPrivate::equalStrings(QStringView lhs,QLatin1StringView rhs)

{
  storage_type_conflict *psVar1;
  byte bVar2;
  storage_type_conflict sVar3;
  byte *pbVar4;
  storage_type_conflict *psVar5;
  int iVar6;
  
  psVar5 = lhs.m_data;
  pbVar4 = (byte *)rhs.m_data;
  psVar1 = psVar5 + lhs.m_size;
  do {
    if (psVar1 <= psVar5) {
      iVar6 = 0;
      break;
    }
    sVar3 = *psVar5;
    bVar2 = *pbVar4;
    psVar5 = psVar5 + 1;
    pbVar4 = pbVar4 + 1;
    iVar6 = (uint)(ushort)sVar3 - (uint)bVar2;
  } while (iVar6 == 0);
  return iVar6 == 0;
}

Assistant:

static int ucstrncmp(const char16_t *a, const char *b, size_t l)
{
    const uchar *c = reinterpret_cast<const uchar *>(b);
    const char16_t *uc = a;
    const char16_t *e = uc + l;

#if defined(__SSE2__) && !defined(__OPTIMIZE_SIZE__)
    return ucstrncmp_sse2<Mode>(uc, c, l);
#endif

    while (uc < e) {
        int diff = *uc - *c;
        if (diff)
            return diff;
        uc++, c++;
    }

    return 0;
}